

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O3

int can_fixup_bittiming_v6_3
              (net_device *dev,can_bittiming *bt,can_bittiming_const *btc,netlink_ext_ack *extack)

{
  uint uVar1;
  __u32 _min1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = bt->phase_seg1;
  uVar6 = bt->prop_seg + uVar5;
  iVar3 = -0x16;
  if ((((btc->tseg1_min <= uVar6) && (uVar6 <= btc->tseg1_max)) &&
      (uVar1 = bt->phase_seg2, btc->tseg2_min <= uVar1)) && (uVar1 <= btc->tseg2_max)) {
    uVar4 = bt->sjw;
    if (uVar4 == 0) {
      uVar4 = uVar1 >> 1;
      if (uVar5 < uVar1 >> 1) {
        uVar4 = uVar5;
      }
      uVar4 = uVar4 + (uVar4 == 0);
      bt->sjw = uVar4;
    }
    if (((uVar4 <= uVar1) && (uVar4 <= uVar5)) && (uVar4 <= btc->sjw_max)) {
      uVar2 = (ulong)bt->tq * (ulong)(dev->priv).clock.freq;
      uVar5 = btc->brp_inc;
      if (1 < (ulong)uVar5) {
        uVar2 = uVar2 / uVar5;
      }
      uVar4 = 1;
      if (1 < uVar5) {
        uVar4 = uVar5;
      }
      uVar4 = (int)((uVar2 + 499999999) / 1000000000) * uVar4;
      bt->brp = uVar4;
      if ((btc->brp_min <= uVar4) && (uVar4 <= btc->brp_max)) {
        uVar5 = uVar6 + uVar1 + 1;
        iVar3 = 0;
        bt->bitrate = (dev->priv).clock.freq / (uVar4 * uVar5);
        bt->sample_point = (uVar6 * 1000 + 1000) / uVar5;
        uVar5 = (dev->priv).clock.freq;
        bt->tq = (__u32)(((ulong)(uVar5 >> 1) + (ulong)uVar4 * 1000000000) / (ulong)uVar5);
      }
    }
  }
  return iVar3;
}

Assistant:

static int can_fixup_bittiming(const struct net_device *dev, struct can_bittiming *bt,
			       const struct can_bittiming_const *btc,
			       struct netlink_ext_ack *extack)
{
	const unsigned int tseg1 = bt->prop_seg + bt->phase_seg1;
	const struct can_priv *priv = netdev_priv(dev);
	u64 brp64;
	int err;

	if (tseg1 < btc->tseg1_min) {
		NL_SET_ERR_MSG_FMT(extack, "prop-seg + phase-seg1: %u less than tseg1-min: %u",
				   tseg1, btc->tseg1_min);
		return -EINVAL;
	}
	if (tseg1 > btc->tseg1_max) {
		NL_SET_ERR_MSG_FMT(extack, "prop-seg + phase-seg1: %u greater than tseg1-max: %u",
				   tseg1, btc->tseg1_max);
		return -EINVAL;
	}
	if (bt->phase_seg2 < btc->tseg2_min) {
		NL_SET_ERR_MSG_FMT(extack, "phase-seg2: %u less than tseg2-min: %u",
				   bt->phase_seg2, btc->tseg2_min);
		return -EINVAL;
	}
	if (bt->phase_seg2 > btc->tseg2_max) {
		NL_SET_ERR_MSG_FMT(extack, "phase-seg2: %u greater than tseg2-max: %u",
				   bt->phase_seg2, btc->tseg2_max);
		return -EINVAL;
	}

	can_sjw_set_default(bt);

	err = can_sjw_check(dev, bt, btc, extack);
	if (err)
		return err;

	brp64 = (u64)priv->clock.freq * (u64)bt->tq;
	if (btc->brp_inc > 1)
		do_div(brp64, btc->brp_inc);
	brp64 += 500000000UL - 1;
	do_div(brp64, 1000000000UL); /* the practicable BRP */
	if (btc->brp_inc > 1)
		brp64 *= btc->brp_inc;
	bt->brp = (u32)brp64;

	if (bt->brp < btc->brp_min) {
		NL_SET_ERR_MSG_FMT(extack, "resulting brp: %u less than brp-min: %u",
				   bt->brp, btc->brp_min);
		return -EINVAL;
	}
	if (bt->brp > btc->brp_max) {
		NL_SET_ERR_MSG_FMT(extack, "resulting brp: %u greater than brp-max: %u",
				   bt->brp, btc->brp_max);
		return -EINVAL;
	}

	bt->bitrate = priv->clock.freq / (bt->brp * can_bit_time(bt));
	bt->sample_point = ((CAN_SYNC_SEG + tseg1) * 1000) / can_bit_time(bt);
	bt->tq = DIV_U64_ROUND_CLOSEST(mul_u32_u32(bt->brp, NSEC_PER_SEC),
				       priv->clock.freq);

	return 0;
}